

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O1

void __thiscall cppcms::rpc::json_call::json_call(json_call *this,context *c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _data *p_Var2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  bool bVar7;
  int iVar8;
  json_type jVar9;
  request *prVar10;
  value *pvVar11;
  value *pvVar12;
  array *paVar13;
  call_error *pcVar14;
  pair<void_*,_unsigned_long> pVar15;
  value request;
  content_type ct;
  string subtype;
  string type;
  istringstream ss;
  value local_230;
  string local_228;
  undefined1 local_208 [56];
  string local_1d0;
  string local_1b0 [3];
  ios_base local_138 [264];
  
  (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pvVar12 = &this->id_;
  json::value::copyable::copyable(&pvVar12->d);
  (this->params_).super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params_).super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params_).super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._16_8_ = &(this->method_).field_2;
  (this->method_)._M_dataplus._M_p = (pointer)local_208._16_8_;
  (this->method_)._M_string_length = 0;
  (this->method_).field_2._M_local_buf[0] = '\0';
  (this->d).ptr_ = (_data *)0x0;
  http::context::request(c);
  http::request::content_type_parsed((request *)local_208);
  http::content_type::type_abi_cxx11_(&local_1d0,(content_type *)local_208);
  http::content_type::subtype_abi_cxx11_((string *)(local_208 + 0x18),(content_type *)local_208);
  iVar8 = std::__cxx11::string::compare((char *)&local_1d0);
  if (iVar8 == 0) {
    iVar8 = std::__cxx11::string::compare(local_208 + 0x18);
    if (iVar8 != 0) {
      iVar8 = std::__cxx11::string::compare(local_208 + 0x18);
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::string::compare(local_208 + 0x18);
        if (iVar8 != 0) goto LAB_0021668b;
      }
    }
    prVar10 = http::context::request(c);
    http::request::request_method_abi_cxx11_(local_1b0,prVar10);
    iVar8 = std::__cxx11::string::compare((char *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    if (iVar8 != 0) {
      pcVar14 = (call_error *)__cxa_allocate_exception(0x30);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Invalid request method","");
      call_error::call_error(pcVar14,local_1b0);
      __cxa_throw(pcVar14,&call_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    prVar10 = http::context::request(c);
    pVar15 = http::request::raw_post_data(prVar10);
    paVar1 = &local_228.field_2;
    local_228._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,pVar15.first,pVar15.second + (long)pVar15.first);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_228,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    json::value::copyable::copyable(&local_230.d);
    bVar7 = json::value::load(&local_230,(istream *)local_1b0,true,(int *)0x0);
    if (bVar7) {
      pvVar11 = json::value::find(&local_230,"method");
      jVar9 = json::value::type(pvVar11);
      if (jVar9 == is_string) {
        pvVar11 = json::value::find(&local_230,"params");
        jVar9 = json::value::type(pvVar11);
        if (jVar9 == is_array) {
          pvVar11 = json::value::find(&local_230,"id");
          jVar9 = json::value::type(pvVar11);
          if (jVar9 != is_undefined) {
            pvVar11 = json::value::find(&local_230,"id");
            jVar9 = json::value::type(pvVar11);
            if (jVar9 == is_null) {
              this->notification_ = true;
            }
            else {
              this->notification_ = false;
              local_228._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"id","");
              pvVar11 = json::value::operator[](&local_230,&local_228);
              p_Var2 = (pvVar11->d).d.ptr_;
              (pvVar11->d).d.ptr_ = (pvVar12->d).d.ptr_;
              (pvVar12->d).d.ptr_ = p_Var2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != paVar1) {
                operator_delete(local_228._M_dataplus._M_p);
              }
            }
            local_228._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"params","");
            pvVar12 = json::value::operator[](&local_230,&local_228);
            paVar13 = json::value::array(pvVar12);
            pvVar3 = (this->params_).
                     super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar4 = (paVar13->
                     super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            pvVar5 = (this->params_).
                     super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pvVar6 = (this->params_).
                     super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            (this->params_).
            super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (paVar13->
                 super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                 _M_impl.super__Vector_impl_data._M_start;
            (this->params_).
            super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>._M_impl.
            super__Vector_impl_data._M_finish = pvVar4;
            (this->params_).
            super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (paVar13->
                 super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            (paVar13->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>)
            ._M_impl.super__Vector_impl_data._M_start = pvVar5;
            (paVar13->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>)
            ._M_impl.super__Vector_impl_data._M_finish = pvVar6;
            (paVar13->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != paVar1) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            json::value::get<std::__cxx11::string>(&local_228,&local_230,"method");
            std::__cxx11::string::operator=((string *)&this->method_,(string *)&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != paVar1) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            json::value::copyable::~copyable(&local_230.d);
            std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
            std::ios_base::~ios_base(local_138);
            if ((_Base_ptr)local_208._24_8_ != (_Base_ptr)(local_208 + 0x28)) {
              operator_delete((void *)local_208._24_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
            http::content_type::~content_type((content_type *)local_208);
            return;
          }
        }
      }
      pcVar14 = (call_error *)__cxa_allocate_exception(0x30);
      local_228._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Invalid JSON-RPC","");
      call_error::call_error(pcVar14,&local_228);
      __cxa_throw(pcVar14,&call_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    pcVar14 = (call_error *)__cxa_allocate_exception(0x30);
    local_228._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Invalid JSON","");
    call_error::call_error(pcVar14,&local_228);
    __cxa_throw(pcVar14,&call_error::typeinfo,booster::runtime_error::~runtime_error);
  }
LAB_0021668b:
  pcVar14 = (call_error *)__cxa_allocate_exception(0x30);
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Invalid content type","");
  call_error::call_error(pcVar14,local_1b0);
  __cxa_throw(pcVar14,&call_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

json_call::json_call(http::context &c) 
	{
		http::content_type ct = c.request().content_type_parsed();
		std::string type = ct.type();
		std::string subtype = ct.subtype();
		if(type != "application" || (subtype!="json" && subtype!="jsonrequest" && subtype!="json-rpc"))
			throw call_error("Invalid content type"); 
		if(c.request().request_method()!="POST")
			throw call_error("Invalid request method"); 
		std::pair<void *,size_t> post_data = c.request().raw_post_data();
		std::istringstream ss(std::string(reinterpret_cast<char const *>(post_data.first),post_data.second));
		json::value request;
		if(!request.load(ss,true))
			throw call_error("Invalid JSON");
		if(	request.type("method")!=json::is_string 
			|| request.type("params")!=json::is_array
			|| request.type("id")==json::is_undefined)
		{
			throw call_error("Invalid JSON-RPC");
		}
		if(request.type("id")==json::is_null) {
			notification_ = true;
		}
		else {
			notification_ = false;
			id_.swap(request["id"]);
		}
		params_.swap(request["params"].array());
		method_ = request.get<std::string>("method");
	}